

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O0

uint RDL_getEdgeArray(RDL_data *data,RDL_edge **ptr)

{
  RDL_edge *paRVar1;
  uint local_2c;
  uint idx;
  RDL_edge *result;
  RDL_edge **ptr_local;
  RDL_data *data_local;
  
  if (data == (RDL_data *)0x0) {
    (*RDL_outputFunc)(RDL_ERROR,"RDL_data is NULL!\n");
    paRVar1 = (RDL_edge *)malloc(8);
    *ptr = paRVar1;
    data_local._4_4_ = 0xffffffff;
  }
  else {
    paRVar1 = (RDL_edge *)malloc((ulong)data->graph->E << 3);
    for (local_2c = 0; local_2c < data->graph->E; local_2c = local_2c + 1) {
      paRVar1[local_2c][0] = *data->graph->edges[local_2c];
      paRVar1[local_2c][1] = data->graph->edges[local_2c][1];
    }
    *ptr = paRVar1;
    data_local._4_4_ = data->graph->E;
  }
  return data_local._4_4_;
}

Assistant:

unsigned RDL_getEdgeArray(const RDL_data *data, RDL_edge **ptr)
{
  RDL_edge *result;
  unsigned idx;

  if (!data) {
    RDL_outputFunc(RDL_ERROR, "RDL_data is NULL!\n");
    (*ptr) = malloc(sizeof(**ptr));
    return RDL_INVALID_RESULT;
  }

  result = malloc(data->graph->E * sizeof(*result));
  for(idx=0; idx<data->graph->E; ++idx)
  {
    result[idx][0] = data->graph->edges[idx][0];
    result[idx][1] = data->graph->edges[idx][1];
  }
  (*ptr) = result;
  return data->graph->E;
}